

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O2

Orphan<capnp::List<capnp::schema::CodeGeneratorRequest::RequestedFile::Import,_(capnp::Kind)3>_> *
__thiscall
capnp::compiler::Compiler::getFileImportTable
          (Orphan<capnp::List<capnp::schema::CodeGeneratorRequest::RequestedFile::Import,_(capnp::Kind)3>_>
           *__return_storage_ptr__,Compiler *this,Module *module,Orphanage orphanage)

{
  Locked<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> LStack_38;
  
  kj::MutexGuarded<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_>::lockExclusive
            ((MutexGuarded<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> *)&LStack_38,
             &this->impl);
  Impl::getFileImportTable(__return_storage_ptr__,(LStack_38.ptr)->ptr,module,orphanage);
  kj::Locked<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_>::~Locked(&LStack_38);
  return __return_storage_ptr__;
}

Assistant:

Orphan<List<schema::CodeGeneratorRequest::RequestedFile::Import>>
    Compiler::getFileImportTable(Module& module, Orphanage orphanage) const {
  return impl.lockExclusive()->get()->getFileImportTable(module, orphanage);
}